

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O0

void rsg::computeUniformValues
               (Random *rnd,vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *values,
               vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *uniforms
               )

{
  ConstValueRangeAccess valueRange;
  bool bVar1;
  reference ppSVar2;
  Variable *variable;
  size_type sVar3;
  reference this;
  ConstValueRangeAccess local_90;
  ConstStridedValueAccess<1> local_78;
  VariableValue local_58;
  ShaderInput *local_38;
  ShaderInput *uniform;
  __normal_iterator<const_rsg::ShaderInput_*const_*,_std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>_>
  local_28;
  const_iterator i;
  vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *uniforms_local;
  vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *values_local;
  Random *rnd_local;
  
  i._M_current = (ShaderInput **)uniforms;
  local_28._M_current =
       (ShaderInput **)
       std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>::begin
                 (uniforms);
  while( true ) {
    uniform = (ShaderInput *)
              std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>::end
                        ((vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                          *)i._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_rsg::ShaderInput_*const_*,_std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>_>
                        *)&uniform);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<const_rsg::ShaderInput_*const_*,_std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>_>
              ::operator*(&local_28);
    local_38 = *ppSVar2;
    variable = ShaderInput::getVariable(local_38);
    VariableValue::VariableValue(&local_58,variable);
    std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::push_back
              (values,&local_58);
    VariableValue::~VariableValue(&local_58);
    sVar3 = std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::size(values);
    this = std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::operator[]
                     (values,sVar3 - 1);
    local_78 = (ConstStridedValueAccess<1>)VariableValue::getValue(this);
    ShaderInput::getValueRange(&local_90,local_38);
    valueRange.m_min = local_90.m_min;
    valueRange.m_type = local_90.m_type;
    valueRange.m_max = local_90.m_max;
    computeRandomValue(rnd,(ValueAccess)local_78,valueRange);
    __gnu_cxx::
    __normal_iterator<const_rsg::ShaderInput_*const_*,_std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>_>
    ::operator++(&local_28,0);
  }
  return;
}

Assistant:

void computeUniformValues (de::Random& rnd, std::vector<VariableValue>& values, const std::vector<const ShaderInput*>& uniforms)
{
	DE_ASSERT(values.empty());
	for (vector<const ShaderInput*>::const_iterator i = uniforms.begin(); i != uniforms.end(); i++)
	{
		const ShaderInput* uniform = *i;
		values.push_back(VariableValue(uniform->getVariable()));
		computeRandomValue(rnd, values[values.size()-1].getValue(), uniform->getValueRange());
	}
}